

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O1

bool __thiscall
QTest::QTouchEventWidgetSequence::commit(QTouchEventWidgetSequence *this,bool processEvents)

{
  undefined1 *this_00;
  undefined8 uVar1;
  undefined1 uVar2;
  QWindow *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QEventPoint> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)&this->field_0x10 == 0) || (*(long *)(*(long *)&this->field_0x10 + 0x30) == 0)) {
    uVar2 = 0;
    goto LAB_002f5280;
  }
  this_00 = &this->field_0x10;
  QThread::sleep(1000000);
  pQVar3 = *(QWindow **)&this->field_0x18;
  if (pQVar3 == (QWindow *)0x0) {
    if (this->targetWidget != (QWidget *)0x0) {
      pQVar3 = QWidget::windowHandle(this->targetWidget);
      goto LAB_002f5229;
    }
    uVar2 = 0;
  }
  else {
LAB_002f5229:
    uVar1 = *(undefined8 *)&this->field_0x20;
    QMap<int,_QEventPoint>::values
              ((QList<QEventPoint> *)&local_50,(QMap<int,_QEventPoint> *)this_00);
    uVar2 = qt_handleTouchEventv2(pQVar3,uVar1,&local_50,0);
    QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_50);
  }
  if (processEvents) {
    QCoreApplication::processEvents(0);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  ::operator=((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
               *)&this->field_0x8,
              (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
               *)this_00);
  QMap<int,_QEventPoint>::clear((QMap<int,_QEventPoint> *)this_00);
LAB_002f5280:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTouchEventWidgetSequence::commit(bool processEvents)
{
    bool ret = false;
    if (points.isEmpty())
        return ret;
    QThread::sleep(std::chrono::milliseconds{1});
    if (targetWindow) {
        ret = qt_handleTouchEventv2(targetWindow, device, points.values());
    } else if (targetWidget) {
        ret = qt_handleTouchEventv2(targetWidget->windowHandle(), device, points.values());
    }
    if (processEvents)
        QCoreApplication::processEvents();
    previousPoints = points;
    points.clear();
    return ret;
}